

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

DisasJumpType op_clm(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  int val;
  TCGv_i32 pTVar1;
  TCGv_i32 ret;
  uintptr_t o_1;
  uintptr_t o_2;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGv_i64 local_40;
  
  tcg_ctx = s->uc->tcg_ctx;
  val = get_field1(s,FLD_O_m3,FLD_C_i3);
  pTVar1 = tcg_const_i32_s390x(tcg_ctx,val);
  ret = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_extrl_i64_i32_s390x(tcg_ctx,ret,o->in1);
  local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_40 = o->in2 + (long)tcg_ctx;
  local_50 = (TCGTemp *)(ret + (long)tcg_ctx);
  local_48 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
  tcg_gen_callN_s390x(tcg_ctx,helper_clm,(TCGTemp *)(tcg_ctx->cc_op + (long)tcg_ctx),4,&local_58);
  set_cc_static(s);
  tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_clm(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 m3 = tcg_const_i32(tcg_ctx, get_field(s, m3));
    TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_extrl_i64_i32(tcg_ctx, t1, o->in1);
    gen_helper_clm(tcg_ctx, tcg_ctx->cc_op, tcg_ctx->cpu_env, t1, m3, o->in2);
    set_cc_static(s);
    tcg_temp_free_i32(tcg_ctx, t1);
    tcg_temp_free_i32(tcg_ctx, m3);
    return DISAS_NEXT;
}